

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerBailTarget(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  LabelInstr *branchTarget;
  BranchInstr *instr_00;
  
  pIVar1 = instr->m_prev;
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instr,&branchTarget->super_Instr);
  instr_00 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
  GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailTarget(IR::Instr * instr)
{
    // this is just a bailout target, just skip over it and generate a label before so other bailout can jump here.
    IR::Instr * prevInstr = instr->m_prev;

    IR::LabelInstr * continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    instr->InsertAfter(continueLabelInstr);

    IR::BranchInstr * skipInstr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, continueLabelInstr, this->m_func);
    instr->InsertBefore(skipInstr);

    this->GenerateBailOut(instr);

    return prevInstr;
}